

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int64_t __thiscall
icu_63::CollationBuilder::getSpecialResetPosition
          (CollationBuilder *this,UnicodeString *str,char **parserErrorReason,UErrorCode *errorCode)

{
  bool bVar1;
  UBool UVar2;
  char16_t cVar3;
  uint32_t uVar4;
  int32_t iVar5;
  int32_t iVar6;
  int64_t iVar7;
  int64_t nextNode;
  int32_t nextIndex;
  UBool isCompressible;
  int32_t pIndex;
  uint32_t p;
  int64_t node;
  int64_t iStack_60;
  int32_t index;
  int64_t node_2;
  int32_t index_2;
  int64_t node_1;
  int32_t index_1;
  UChar32 pos;
  UBool isBoundary;
  CollationBuilder *pCStack_38;
  int32_t strength;
  int64_t ce;
  UErrorCode *errorCode_local;
  char **parserErrorReason_local;
  UnicodeString *str_local;
  CollationBuilder *this_local;
  
  pos = 0;
  bVar1 = false;
  cVar3 = UnicodeString::charAt(str,1);
  switch((ushort)cVar3 - 0x2800) {
  case 0:
    return 0;
  case 1:
    return 0;
  case 2:
    iVar5 = findOrInsertNodeForRootCE(this,0,2,errorCode);
    UVar2 = ::U_FAILURE(*errorCode);
    if (UVar2 != '\0') {
      return 0;
    }
    iVar7 = UVector64::elementAti(&this->nodes,iVar5);
    iVar5 = nextIndexFromNode(iVar7);
    if (iVar5 != 0) {
      iVar7 = UVector64::elementAti(&this->nodes,iVar5);
      UVar2 = isTailoredNode(iVar7);
      if ((UVar2 != '\0') && (iVar6 = strengthFromNode(iVar7), iVar6 == 2)) {
        iVar7 = tempCEFromIndexAndStrength(iVar5,2);
        return iVar7;
      }
    }
    uVar4 = CollationRootElements::getFirstTertiaryCE(&this->rootElements);
    return (ulong)uVar4;
  case 3:
    uVar4 = CollationRootElements::getLastTertiaryCE(&this->rootElements);
    pCStack_38 = (CollationBuilder *)(ulong)uVar4;
    pos = 2;
    break;
  case 4:
    iVar5 = findOrInsertNodeForRootCE(this,0,1,errorCode);
    UVar2 = ::U_FAILURE(*errorCode);
    if (UVar2 != '\0') {
      return 0;
    }
    iStack_60 = UVector64::elementAti(&this->nodes,iVar5);
    do {
      node_2._4_4_ = nextIndexFromNode(iStack_60);
      if (node_2._4_4_ == 0) goto LAB_0028bab4;
      iStack_60 = UVector64::elementAti(&this->nodes,node_2._4_4_);
      iVar5 = strengthFromNode(iStack_60);
      if (iVar5 < 1) goto LAB_0028bab4;
    } while (iVar5 != 1);
    UVar2 = isTailoredNode(iStack_60);
    if (UVar2 != '\0') {
      UVar2 = nodeHasBefore3(iStack_60);
      if (UVar2 != '\0') {
        iVar5 = nextIndexFromNode(iStack_60);
        iVar7 = UVector64::elementAti(&this->nodes,iVar5);
        node_2._4_4_ = nextIndexFromNode(iVar7);
      }
      iVar7 = tempCEFromIndexAndStrength(node_2._4_4_,1);
      return iVar7;
    }
LAB_0028bab4:
    uVar4 = CollationRootElements::getFirstSecondaryCE(&this->rootElements);
    pCStack_38 = (CollationBuilder *)(ulong)uVar4;
    pos = 1;
    break;
  case 5:
    uVar4 = CollationRootElements::getLastSecondaryCE(&this->rootElements);
    pCStack_38 = (CollationBuilder *)(ulong)uVar4;
    pos = 1;
    break;
  case 6:
    pCStack_38 = (CollationBuilder *)CollationRootElements::getFirstPrimaryCE(&this->rootElements);
    bVar1 = true;
    break;
  case 7:
    pCStack_38 = (CollationBuilder *)
                 CollationRootElements::lastCEWithPrimaryBefore
                           (&this->rootElements,this->variableTop + 1);
    break;
  case 8:
    pCStack_38 = (CollationBuilder *)
                 CollationRootElements::firstCEWithPrimaryAtLeast
                           (&this->rootElements,this->variableTop + 1);
    bVar1 = true;
    break;
  case 9:
    uVar4 = CollationData::getFirstPrimaryForGroup(this->baseData,0x11);
    pCStack_38 = (CollationBuilder *)
                 CollationRootElements::firstCEWithPrimaryAtLeast(&this->rootElements,uVar4);
    break;
  case 10:
    pCStack_38 = (CollationBuilder *)CollationData::getSingleCE(this->baseData,0x4e00,errorCode);
    break;
  case 0xb:
    *errorCode = U_UNSUPPORTED_ERROR;
    *parserErrorReason = "reset to [last implicit] not supported";
    return 0;
  case 0xc:
    pCStack_38 = (CollationBuilder *)Collation::makeCE(0xff020200);
    bVar1 = true;
    break;
  case 0xd:
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    *parserErrorReason = "LDML forbids tailoring to U+FFFF";
    return 0;
  default:
    return 0;
  }
  node._4_4_ = findOrInsertNodeForRootCE(this,(int64_t)pCStack_38,pos,errorCode);
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 == '\0') {
    _pIndex = UVector64::elementAti(&this->nodes,node._4_4_);
    iVar7 = _pIndex;
    iVar5 = node._4_4_;
    if (((ushort)cVar3 - 0x2800 & 1) == 0) {
      UVar2 = nodeHasAnyBefore(_pIndex);
      if ((UVar2 == '\0') && (bVar1)) {
        node._4_4_ = nextIndexFromNode(_pIndex);
        if (node._4_4_ == 0) {
          uVar4 = (uint32_t)((ulong)pCStack_38 >> 0x20);
          iVar5 = CollationRootElements::findPrimary(&this->rootElements,uVar4);
          UVar2 = CollationData::isCompressiblePrimary(this->baseData,uVar4);
          uVar4 = CollationRootElements::getPrimaryAfter(&this->rootElements,uVar4,iVar5,UVar2);
          pCStack_38 = (CollationBuilder *)Collation::makeCE(uVar4);
          node._4_4_ = findOrInsertNodeForRootCE(this,(int64_t)pCStack_38,0,errorCode);
          UVar2 = ::U_FAILURE(*errorCode);
          if (UVar2 != '\0') {
            return 0;
          }
          _pIndex = UVector64::elementAti(&this->nodes,node._4_4_);
        }
        else {
          _pIndex = UVector64::elementAti(&this->nodes,node._4_4_);
          pCStack_38 = (CollationBuilder *)tempCEFromIndexAndStrength(node._4_4_,pos);
        }
      }
      UVar2 = nodeHasAnyBefore(_pIndex);
      if (UVar2 != '\0') {
        UVar2 = nodeHasBefore2(_pIndex);
        if (UVar2 != '\0') {
          iVar5 = nextIndexFromNode(_pIndex);
          iVar7 = UVector64::elementAti(&this->nodes,iVar5);
          node._4_4_ = nextIndexFromNode(iVar7);
          _pIndex = UVector64::elementAti(&this->nodes,node._4_4_);
        }
        UVar2 = nodeHasBefore3(_pIndex);
        if (UVar2 != '\0') {
          iVar5 = nextIndexFromNode(_pIndex);
          iVar7 = UVector64::elementAti(&this->nodes,iVar5);
          node._4_4_ = nextIndexFromNode(iVar7);
        }
        pCStack_38 = (CollationBuilder *)tempCEFromIndexAndStrength(node._4_4_,pos);
      }
    }
    else {
      do {
        node._4_4_ = iVar5;
        _pIndex = iVar7;
        iVar5 = nextIndexFromNode(_pIndex);
        if (iVar5 == 0) break;
        iVar7 = UVector64::elementAti(&this->nodes,iVar5);
        iVar6 = strengthFromNode(iVar7);
      } while (pos <= iVar6);
      UVar2 = isTailoredNode(_pIndex);
      if (UVar2 != '\0') {
        pCStack_38 = (CollationBuilder *)tempCEFromIndexAndStrength(node._4_4_,pos);
      }
    }
    this_local = pCStack_38;
  }
  else {
    this_local = (CollationBuilder *)0x0;
  }
  return (int64_t)this_local;
}

Assistant:

int64_t
CollationBuilder::getSpecialResetPosition(const UnicodeString &str,
                                          const char *&parserErrorReason, UErrorCode &errorCode) {
    U_ASSERT(str.length() == 2);
    int64_t ce;
    int32_t strength = UCOL_PRIMARY;
    UBool isBoundary = FALSE;
    UChar32 pos = str.charAt(1) - CollationRuleParser::POS_BASE;
    U_ASSERT(0 <= pos && pos <= CollationRuleParser::LAST_TRAILING);
    switch(pos) {
    case CollationRuleParser::FIRST_TERTIARY_IGNORABLE:
        // Quaternary CEs are not supported.
        // Non-zero quaternary weights are possible only on tertiary or stronger CEs.
        return 0;
    case CollationRuleParser::LAST_TERTIARY_IGNORABLE:
        return 0;
    case CollationRuleParser::FIRST_SECONDARY_IGNORABLE: {
        // Look for a tailored tertiary node after [0, 0, 0].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_TERTIARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        if((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            U_ASSERT(strengthFromNode(node) <= UCOL_TERTIARY);
            if(isTailoredNode(node) && strengthFromNode(node) == UCOL_TERTIARY) {
                return tempCEFromIndexAndStrength(index, UCOL_TERTIARY);
            }
        }
        return rootElements.getFirstTertiaryCE();
        // No need to look for nodeHasAnyBefore() on a tertiary node.
    }
    case CollationRuleParser::LAST_SECONDARY_IGNORABLE:
        ce = rootElements.getLastTertiaryCE();
        strength = UCOL_TERTIARY;
        break;
    case CollationRuleParser::FIRST_PRIMARY_IGNORABLE: {
        // Look for a tailored secondary node after [0, 0, *].
        int32_t index = findOrInsertNodeForRootCE(0, UCOL_SECONDARY, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        int64_t node = nodes.elementAti(index);
        while((index = nextIndexFromNode(node)) != 0) {
            node = nodes.elementAti(index);
            strength = strengthFromNode(node);
            if(strength < UCOL_SECONDARY) { break; }
            if(strength == UCOL_SECONDARY) {
                if(isTailoredNode(node)) {
                    if(nodeHasBefore3(node)) {
                        index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                        U_ASSERT(isTailoredNode(nodes.elementAti(index)));
                    }
                    return tempCEFromIndexAndStrength(index, UCOL_SECONDARY);
                } else {
                    break;
                }
            }
        }
        ce = rootElements.getFirstSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    }
    case CollationRuleParser::LAST_PRIMARY_IGNORABLE:
        ce = rootElements.getLastSecondaryCE();
        strength = UCOL_SECONDARY;
        break;
    case CollationRuleParser::FIRST_VARIABLE:
        ce = rootElements.getFirstPrimaryCE();
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 00A0, SPACE first primary
        break;
    case CollationRuleParser::LAST_VARIABLE:
        ce = rootElements.lastCEWithPrimaryBefore(variableTop + 1);
        break;
    case CollationRuleParser::FIRST_REGULAR:
        ce = rootElements.firstCEWithPrimaryAtLeast(variableTop + 1);
        isBoundary = TRUE;  // FractionalUCA.txt: FDD1 263A, SYMBOL first primary
        break;
    case CollationRuleParser::LAST_REGULAR:
        // Use the Hani-first-primary rather than the actual last "regular" CE before it,
        // for backward compatibility with behavior before the introduction of
        // script-first-primary CEs in the root collator.
        ce = rootElements.firstCEWithPrimaryAtLeast(
            baseData->getFirstPrimaryForGroup(USCRIPT_HAN));
        break;
    case CollationRuleParser::FIRST_IMPLICIT:
        ce = baseData->getSingleCE(0x4e00, errorCode);
        break;
    case CollationRuleParser::LAST_IMPLICIT:
        // We do not support tailoring to an unassigned-implicit CE.
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "reset to [last implicit] not supported";
        return 0;
    case CollationRuleParser::FIRST_TRAILING:
        ce = Collation::makeCE(Collation::FIRST_TRAILING_PRIMARY);
        isBoundary = TRUE;  // trailing first primary (there is no mapping for it)
        break;
    case CollationRuleParser::LAST_TRAILING:
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        parserErrorReason = "LDML forbids tailoring to U+FFFF";
        return 0;
    default:
        U_ASSERT(FALSE);
        return 0;
    }

    int32_t index = findOrInsertNodeForRootCE(ce, strength, errorCode);
    if(U_FAILURE(errorCode)) { return 0; }
    int64_t node = nodes.elementAti(index);
    if((pos & 1) == 0) {
        // even pos = [first xyz]
        if(!nodeHasAnyBefore(node) && isBoundary) {
            // A <group> first primary boundary is artificially added to FractionalUCA.txt.
            // It is reachable via its special contraction, but is not normally used.
            // Find the first character tailored after the boundary CE,
            // or the first real root CE after it.
            if((index = nextIndexFromNode(node)) != 0) {
                // If there is a following node, then it must be tailored
                // because there are no root CEs with a boundary primary
                // and non-common secondary/tertiary weights.
                node = nodes.elementAti(index);
                U_ASSERT(isTailoredNode(node));
                ce = tempCEFromIndexAndStrength(index, strength);
            } else {
                U_ASSERT(strength == UCOL_PRIMARY);
                uint32_t p = (uint32_t)(ce >> 32);
                int32_t pIndex = rootElements.findPrimary(p);
                UBool isCompressible = baseData->isCompressiblePrimary(p);
                p = rootElements.getPrimaryAfter(p, pIndex, isCompressible);
                ce = Collation::makeCE(p);
                index = findOrInsertNodeForRootCE(ce, UCOL_PRIMARY, errorCode);
                if(U_FAILURE(errorCode)) { return 0; }
                node = nodes.elementAti(index);
            }
        }
        if(nodeHasAnyBefore(node)) {
            // Get the first node that was tailored before this one at a weaker strength.
            if(nodeHasBefore2(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
                node = nodes.elementAti(index);
            }
            if(nodeHasBefore3(node)) {
                index = nextIndexFromNode(nodes.elementAti(nextIndexFromNode(node)));
            }
            U_ASSERT(isTailoredNode(nodes.elementAti(index)));
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    } else {
        // odd pos = [last xyz]
        // Find the last node that was tailored after the [last xyz]
        // at a strength no greater than the position's strength.
        for(;;) {
            int32_t nextIndex = nextIndexFromNode(node);
            if(nextIndex == 0) { break; }
            int64_t nextNode = nodes.elementAti(nextIndex);
            if(strengthFromNode(nextNode) < strength) { break; }
            index = nextIndex;
            node = nextNode;
        }
        // Do not make a temporary CE for a root node.
        // This last node might be the node for the root CE itself,
        // or a node with a common secondary or tertiary weight.
        if(isTailoredNode(node)) {
            ce = tempCEFromIndexAndStrength(index, strength);
        }
    }
    return ce;
}